

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sn76496.c
# Opt level: O0

void sn76496_w_mame(void *chip,UINT8 reg,UINT8 data)

{
  UINT8 data_local;
  UINT8 reg_local;
  void *chip_local;
  
  if (reg == '\0') {
    sn76496_write_reg(chip,'\0',data);
  }
  else if (reg == '\x01') {
    sn76496_stereo_w(chip,'\0',data);
  }
  return;
}

Assistant:

static void sn76496_w_mame(void *chip, UINT8 reg, UINT8 data)
{
	switch(reg)
	{
	case SN76496_W_REG:
		sn76496_write_reg(chip, 0x00, data);
		break;
	case SN76496_W_GGST:
		sn76496_stereo_w(chip, 0x00, data);
		break;
	}
	return;
}